

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

void __thiscall llvm::cl::Option::removeArgument(Option *this)

{
  SubCommand *pSVar1;
  atomic<void_*> aVar2;
  void **ppvVar3;
  bool bVar4;
  uint *puVar5;
  uint *puVar6;
  SubCommand *in_RDX;
  SubCommand *extraout_RDX;
  SubCommand *extraout_RDX_00;
  SubCommand *extraout_RDX_01;
  SubCommand *extraout_RDX_02;
  SubCommand *extraout_RDX_03;
  SubCommand *extraout_RDX_04;
  uint *puVar7;
  iterator __begin4;
  SmallPtrSetIteratorImpl local_48;
  SmallPtrSetIteratorImpl local_38;
  
  if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    ManagedStaticBase::RegisterManagedStatic
              (&GlobalParser.super_ManagedStaticBase,
               object_creator<(anonymous_namespace)::CommandLineParser>::call,
               object_deleter<(anonymous_namespace)::CommandLineParser>::call);
    in_RDX = extraout_RDX;
  }
  aVar2._M_b._M_p = GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p;
  if ((this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
      NumNonEmpty ==
      (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
      NumTombstones) {
    if (TopLevelSubCommand == (Option *)0x0) {
      ManagedStaticBase::RegisterManagedStatic
                ((ManagedStaticBase *)&TopLevelSubCommand,object_creator<llvm::cl::SubCommand>::call
                 ,object_deleter<llvm::cl::SubCommand>::call);
      in_RDX = extraout_RDX_00;
    }
    anon_unknown.dwarf_2f056::CommandLineParser::removeOption
              ((CommandLineParser *)this,TopLevelSubCommand,in_RDX);
    return;
  }
  bVar4 = any_of<llvm::SmallPtrSet<llvm::cl::SubCommand*,4u>const&,llvm::cl::Option::isInAllSubCommands()const::_lambda(llvm::cl::SubCommand_const*)_1_>
                    (&this->Subs);
  if (bVar4) {
    local_38.Bucket = *(void ***)((long)aVar2._M_b._M_p + 0xf0);
    puVar5 = (uint *)((long)aVar2._M_b._M_p + 0xf8);
    if (local_38.Bucket == *(void ***)((long)aVar2._M_b._M_p + 0xe8)) {
      puVar5 = (uint *)((long)aVar2._M_b._M_p + 0xfc);
    }
    local_38.End = local_38.Bucket + *puVar5;
    SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_38);
    local_48.Bucket = local_38.Bucket;
    local_48.End = local_38.End;
    puVar5 = (uint *)((long)aVar2._M_b._M_p + 0xf8);
    if (*(long *)((long)aVar2._M_b._M_p + 0xf0) == *(long *)((long)aVar2._M_b._M_p + 0xe8)) {
      puVar5 = (uint *)((long)aVar2._M_b._M_p + 0xfc);
    }
    local_38.Bucket = (void **)(*(long *)((long)aVar2._M_b._M_p + 0xf0) + (ulong)*puVar5 * 8);
    local_38.End = local_38.Bucket;
    SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_38);
    ppvVar3 = local_38.Bucket;
    pSVar1 = extraout_RDX_01;
    while (local_48.Bucket != ppvVar3) {
      if (local_48.End <= local_48.Bucket) {
LAB_0011162c:
        __assert_fail("Bucket < End",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                      ,0x122,
                      "const PtrTy llvm::SmallPtrSetIterator<llvm::cl::SubCommand *>::operator*() const [PtrTy = llvm::cl::SubCommand *]"
                     );
      }
      anon_unknown.dwarf_2f056::CommandLineParser::removeOption
                ((CommandLineParser *)this,(Option *)*local_48.Bucket,pSVar1);
      local_48.Bucket = local_48.Bucket + 1;
      SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_48);
      pSVar1 = extraout_RDX_02;
    }
  }
  else {
    local_38.Bucket =
         (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
         CurArray;
    puVar5 = &(this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
              NumNonEmpty;
    puVar7 = &(this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
              CurArraySize;
    puVar6 = puVar7;
    if (local_38.Bucket ==
        (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
        SmallArray) {
      puVar6 = puVar5;
    }
    local_38.End = local_38.Bucket + *puVar6;
    SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_38);
    local_48.Bucket = local_38.Bucket;
    local_48.End = local_38.End;
    local_38.Bucket =
         (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
         CurArray;
    if (local_38.Bucket ==
        (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
        SmallArray) {
      puVar7 = puVar5;
    }
    local_38.Bucket = local_38.Bucket + *puVar7;
    local_38.End = local_38.Bucket;
    SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_38);
    ppvVar3 = local_38.Bucket;
    pSVar1 = extraout_RDX_03;
    while (local_48.Bucket != ppvVar3) {
      if (local_48.End <= local_48.Bucket) goto LAB_0011162c;
      anon_unknown.dwarf_2f056::CommandLineParser::removeOption
                ((CommandLineParser *)this,(Option *)*local_48.Bucket,pSVar1);
      local_48.Bucket = local_48.Bucket + 1;
      SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_48);
      pSVar1 = extraout_RDX_04;
    }
  }
  return;
}

Assistant:

void Option::removeArgument() { GlobalParser->removeOption(this); }